

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk_file_transfer.cpp
# Opt level: O0

TonkFile tonk_file_from_buffer
                   (TonkConnection connection,uint32_t channel,char *name,void *data,uint32_t bytes,
                   uint32_t flags)

{
  bool bVar1;
  TonkFileTransfer *pTVar2;
  char *pcVar3;
  uint8_t *puVar4;
  uint8_t *in_RCX;
  char *in_RDX;
  uint32_t in_ESI;
  TonkConnection in_RDI;
  uint in_R8D;
  uint in_R9D;
  TonkFileTransfer *transfer;
  TonkFileTransfer *in_stack_ffffffffffffff90;
  TonkFileTransfer *local_60;
  TonkFileTransfer *in_stack_ffffffffffffffb0;
  TonkFileTransfer *local_8;
  
  if (((in_RDI == (TonkConnection)0x0) || (in_RDX == (char *)0x0)) || (in_RCX == (uint8_t *)0x0)) {
    local_8 = (TonkFileTransfer *)0x0;
  }
  else {
    pTVar2 = (TonkFileTransfer *)operator_new(0xd8,(nothrow_t *)&std::nothrow);
    local_60 = (TonkFileTransfer *)0x0;
    if (pTVar2 != (TonkFileTransfer *)0x0) {
      TonkFileTransfer::TonkFileTransfer(in_stack_ffffffffffffffb0);
      local_60 = pTVar2;
    }
    if (local_60 == (TonkFileTransfer *)0x0) {
      local_8 = (TonkFileTransfer *)0x0;
    }
    else {
      bVar1 = TonkFileTransfer::SetChannel(local_60,in_ESI);
      if (bVar1) {
        local_60->Connection = in_RDI;
        std::__cxx11::string::operator=((string *)&local_60->NameStr,in_RDX);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        (local_60->super_TonkFile_t).Name = pcVar3;
        if ((in_R9D & 1) == 0) {
          puVar4 = (uint8_t *)operator_new__((ulong)in_R8D,(nothrow_t *)&std::nothrow);
          local_60->InternalDataCopy = puVar4;
          if (local_60->InternalDataCopy == (uint8_t *)0x0) {
            if (local_60 != (TonkFileTransfer *)0x0) {
              TonkFileTransfer::~TonkFileTransfer(in_stack_ffffffffffffff90);
              operator_delete(local_60);
            }
            return (TonkFile)0x0;
          }
          memcpy(local_60->InternalDataCopy,in_RCX,(ulong)in_R8D);
          local_60->AppDataPtr = local_60->InternalDataCopy;
        }
        else {
          local_60->AppDataPtr = in_RCX;
        }
        (local_60->super_TonkFile_t).TotalBytes = (ulong)in_R8D;
        local_8 = local_60;
      }
      else {
        if (local_60 != (TonkFileTransfer *)0x0) {
          TonkFileTransfer::~TonkFileTransfer(local_60);
          operator_delete(local_60);
        }
        local_8 = (TonkFileTransfer *)0x0;
      }
    }
  }
  return &local_8->super_TonkFile_t;
}

Assistant:

TONK_EXPORT TonkFile tonk_file_from_buffer(
    TonkConnection connection,  ///< Connection to send on
    uint32_t          channel,  ///< Reliable channel for data
    const char*          name,  ///< Transfer name
    const void*          data,  ///< File buffer data pointer
    uint32_t            bytes,  ///< File buffer bytes to send
    uint32_t            flags   ///< Flags for buffer
)
{
    // Input validation
    if (!connection || !name || !data) {
        TONK_DEBUG_BREAK();
        return nullptr;
    }

    TonkFileTransfer* transfer = new (std::nothrow) TonkFileTransfer;

    if (!transfer) {
        return nullptr; // OOM
    }

    // Input validation
    if (!transfer->SetChannel(channel)) {
        delete transfer;
        return nullptr;
    }

    transfer->Connection = connection;
    transfer->NameStr = name;
    transfer->Name = transfer->NameStr.c_str();

    if (flags & TONK_FILE_BUFFER_ZERO_COPY) {
        transfer->AppDataPtr = reinterpret_cast<const uint8_t*>(data);
    }
    else {
        transfer->InternalDataCopy = new (std::nothrow) uint8_t[bytes];

        if (!transfer->InternalDataCopy) {
            delete transfer;
            return nullptr; // OOM
        }

        // Make a copy of the app data
        memcpy(transfer->InternalDataCopy, data, bytes);
        transfer->AppDataPtr = transfer->InternalDataCopy;
    }
    transfer->TotalBytes = bytes;

    return reinterpret_cast<TonkFile>(transfer);
}